

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.t.cpp
# Opt level: O3

ostream * operator<<(ostream *os,OracleVal *o)

{
  ostream *poVar1;
  int local_5c;
  char *local_58;
  size_type local_50;
  char local_48 [8];
  undefined8 uStack_40;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[oracle:",8);
  local_5c = *(int *)(o + 4);
  lest::make_value_string<int>(&local_38,&local_5c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    uStack_40 = local_38.field_2._8_8_;
    local_38._M_dataplus._M_p = local_48;
  }
  local_50 = local_38._M_string_length;
  local_58 = local_38._M_dataplus._M_p;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return poVar1;
}

Assistant:

std::ostream & operator<<( std::ostream & os, OracleVal const & o )
{
    using lest::to_string;
    return os << "[oracle:" << to_string( o.i ) << "]";
}